

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autonomy2.cpp
# Opt level: O3

void __thiscall Autonomy2::mainLoop(Autonomy2 *this,bool *run)

{
  int iVar1;
  int iVar2;
  unsigned_short (*pauVar3) [80];
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  bool (*pabVar6) [80];
  pointer pBVar7;
  int y;
  long lVar8;
  long lVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ushort uVar14;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  undefined1 auVar15 [16];
  ushort uVar22;
  undefined1 auVar23 [16];
  Blob blob;
  vector<Commands::Blob,_std::allocator<Commands::Blob>_> commandBlobs;
  list<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_> blobs;
  Control control;
  bool tFrame [60] [80];
  vector<Commands::Blob,_std::allocator<Commands::Blob>_> local_1358;
  _List_node_base local_1340;
  size_type local_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  TripleBuffer<Autonomy2::Blob> *local_1310;
  Control local_1308;
  bool local_12f8 [4808];
  
  if (*run == true) {
    local_1310 = &this->receivedTargetBuffer;
    do {
      TripleBuffer<unsigned_short[60][80]>::swapBack(&this->buffer);
      pauVar3 = *(this->buffer).back;
      auVar12._0_2_ = this->thresholdLow;
      auVar12._2_2_ = this->thresholdHigh;
      auVar12._4_4_ = (this->aPID).p;
      auVar12._8_4_ = (this->aPID).i;
      auVar12._12_4_ = (this->aPID).d;
      auVar11 = pshuflw(*(undefined1 (*) [16])&this->thresholdHigh,
                        *(undefined1 (*) [16])&this->thresholdHigh,0);
      auVar11._4_4_ = auVar11._0_4_;
      auVar11._8_4_ = auVar11._0_4_;
      auVar11._12_4_ = auVar11._0_4_;
      auVar12 = pshuflw(auVar12,auVar12,0);
      auVar13._0_4_ = auVar12._0_4_;
      auVar13._4_4_ = auVar13._0_4_;
      auVar13._8_4_ = auVar13._0_4_;
      auVar13._12_4_ = auVar13._0_4_;
      auVar11 = auVar11 ^ _DAT_001143e0;
      auVar13 = auVar13 ^ _DAT_001143e0;
      lVar8 = 0;
      pabVar6 = (bool (*) [80])local_12f8;
      do {
        lVar9 = 0;
        do {
          auVar12 = *(undefined1 (*) [16])(*(unsigned_short (*) [80])*pauVar3 + lVar9) ^
                    _DAT_001143e0;
          auVar23._0_2_ = -(ushort)(auVar12._0_2_ < auVar11._0_2_);
          auVar23._2_2_ = -(ushort)(auVar12._2_2_ < auVar11._2_2_);
          auVar23._4_2_ = -(ushort)(auVar12._4_2_ < auVar11._4_2_);
          auVar23._6_2_ = -(ushort)(auVar12._6_2_ < auVar11._6_2_);
          auVar23._8_2_ = -(ushort)(auVar12._8_2_ < auVar11._8_2_);
          auVar23._10_2_ = -(ushort)(auVar12._10_2_ < auVar11._10_2_);
          auVar23._12_2_ = -(ushort)(auVar12._12_2_ < auVar11._12_2_);
          auVar23._14_2_ = -(ushort)(auVar12._14_2_ < auVar11._14_2_);
          auVar15._0_2_ = -(ushort)(auVar13._0_2_ < auVar12._0_2_);
          auVar15._2_2_ = -(ushort)(auVar13._2_2_ < auVar12._2_2_);
          auVar15._4_2_ = -(ushort)(auVar13._4_2_ < auVar12._4_2_);
          auVar15._6_2_ = -(ushort)(auVar13._6_2_ < auVar12._6_2_);
          auVar15._8_2_ = -(ushort)(auVar13._8_2_ < auVar12._8_2_);
          auVar15._10_2_ = -(ushort)(auVar13._10_2_ < auVar12._10_2_);
          auVar15._12_2_ = -(ushort)(auVar13._12_2_ < auVar12._12_2_);
          auVar15._14_2_ = -(ushort)(auVar13._14_2_ < auVar12._14_2_);
          auVar15 = auVar15 & auVar23;
          uVar14 = -(auVar15._0_2_ >> 0xf);
          uVar16 = -(auVar15._2_2_ >> 0xf);
          uVar17 = -(auVar15._4_2_ >> 0xf);
          uVar18 = -(auVar15._6_2_ >> 0xf);
          uVar19 = -(auVar15._8_2_ >> 0xf);
          uVar20 = -(auVar15._10_2_ >> 0xf);
          uVar21 = -(auVar15._12_2_ >> 0xf);
          uVar22 = -(auVar15._14_2_ >> 0xf);
          *(ulong *)(*pabVar6 + lVar9) =
               CONCAT17((uVar22 != 0) * (uVar22 < 0x100) * -(auVar15[0xf] >> 7) - (0xff < uVar22),
                        CONCAT16((uVar21 != 0) * (uVar21 < 0x100) * -(auVar15[0xd] >> 7) -
                                 (0xff < uVar21),
                                 CONCAT15((uVar20 != 0) * (uVar20 < 0x100) * -(auVar15[0xb] >> 7) -
                                          (0xff < uVar20),
                                          CONCAT14((uVar19 != 0) * (uVar19 < 0x100) *
                                                   -(auVar15[9] >> 7) - (0xff < uVar19),
                                                   CONCAT13((uVar18 != 0) * (uVar18 < 0x100) *
                                                            -(auVar15[7] >> 7) - (0xff < uVar18),
                                                            CONCAT12((uVar17 != 0) *
                                                                     (uVar17 < 0x100) *
                                                                     -(auVar15[5] >> 7) -
                                                                     (0xff < uVar17),
                                                                     CONCAT11((uVar16 != 0) *
                                                                              (uVar16 < 0x100) *
                                                                              -(auVar15[3] >> 7) -
                                                                              (0xff < uVar16),
                                                                              (uVar14 != 0) *
                                                                              (uVar14 < 0x100) *
                                                                              -(auVar15[1] >> 7) -
                                                                              (0xff < uVar14))))))))
          ;
          lVar9 = lVar9 + 8;
        } while (lVar9 != 0x50);
        lVar8 = lVar8 + 1;
        pauVar3 = pauVar3 + 1;
        pabVar6 = pabVar6 + 1;
      } while (lVar8 != 0x3c);
      findBlobs_abi_cxx11_
                ((list<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_> *)&local_1340,
                 (Autonomy2 *)0x50,(bool (*) [80])local_12f8);
      p_Var5 = local_1340._M_next;
      if (local_1330 != 0) {
        p_Var4 = local_1340._M_next;
        for (p_Var5 = (local_1340._M_next)->_M_next; p_Var5 != &local_1340; p_Var5 = p_Var5->_M_next
            ) {
          if (*(int *)&p_Var4[1]._M_prev < *(int *)&p_Var5[1]._M_prev) {
            p_Var4 = p_Var5;
          }
        }
        local_1328 = p_Var4[1]._M_next;
        uStack_1320 = 0;
        iVar1 = *(int *)&p_Var4[1]._M_prev;
        iVar2 = TripleBuffer<Autonomy2::Blob>::swapBackIfReady(local_1310);
        if (iVar2 != 0) {
          dVar10 = (double)iVar1;
          if (dVar10 < 0.0) {
            dVar10 = sqrt(dVar10);
          }
          else {
            dVar10 = SQRT(dVar10);
          }
          this->targetDist = (float)dVar10;
        }
        std::vector<Commands::Blob,_std::allocator<Commands::Blob>_>::vector
                  (&local_1358,local_1330,(allocator_type *)&local_1308);
        p_Var5 = local_1340._M_next;
        pBVar7 = local_1358.super__Vector_base<Commands::Blob,_std::allocator<Commands::Blob>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (local_1340._M_next != &local_1340) {
          for (; pBVar7 != local_1358.
                           super__Vector_base<Commands::Blob,_std::allocator<Commands::Blob>_>.
                           _M_impl.super__Vector_impl_data._M_finish; pBVar7 = pBVar7 + 1) {
            p_Var4 = p_Var5[1]._M_next;
            pBVar7->x = (int)SUB84(p_Var4,0);
            pBVar7->y = (int)(float)((ulong)p_Var4 >> 0x20);
            pBVar7->size = *(int *)&p_Var5[1]._M_prev;
            if (p_Var5->_M_next == &local_1340) break;
            p_Var5 = p_Var5->_M_next;
          }
        }
        Sender::sendAutonomyBlobs(this->send,&local_1358);
        Sender::sendAutonomyBlob(this->send,(int)(float)local_1328,(int)local_1328._4_4_);
        blob.size = iVar1;
        blob._0_8_ = local_1328;
        local_1308 = calculateFlightControlsPID(this,blob);
        Sender::sendAutonomyControl(this->send,local_1308);
        ControlArbiter::autonomousControl(this->arbiter,&local_1308);
        p_Var5 = local_1340._M_next;
        if (local_1358.super__Vector_base<Commands::Blob,_std::allocator<Commands::Blob>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1358.
                          super__Vector_base<Commands::Blob,_std::allocator<Commands::Blob>_>.
                          _M_impl.super__Vector_impl_data._M_start);
          p_Var5 = local_1340._M_next;
        }
      }
      while (p_Var5 != &local_1340) {
        p_Var4 = (((_List_base<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_> *)&p_Var5->_M_next
                  )->_M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var5);
        p_Var5 = p_Var4;
      }
    } while (*run != false);
  }
  return;
}

Assistant:

void Autonomy2::mainLoop(bool & run) {
  while (run) {
	  buffer.swapBack();
    bool tFrame[ROWS][COLS];
	  threshold(tFrame, buffer.getBack());
    list<Blob> blobs = findBlobs(tFrame);

    // If there exists blobs
    if (blobs.size()) {
      // Calculate target blob
      Blob targetBlob = findLargestBlob(blobs);
      if (receivedTargetBuffer.swapBackIfReady()) {
        // Received target command
        targetDist = sqrt(targetBlob.size);
      }

      // Send all blobs
      vector<Commands::Blob> commandBlobs(blobs.size());
      blobListToCmdBlobVect(commandBlobs, blobs);
      send.sendAutonomyBlobs(commandBlobs);
      send.sendAutonomyBlob(targetBlob.x, targetBlob.y);

      // Calculate Controls
      Control control = calculateFlightControlsPID(targetBlob);
      send.sendAutonomyControl(control);
      arbiter.autonomousControl(control);
    }
  }
}